

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qpropertyanimation.cpp
# Opt level: O1

void QPropertyAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  Data *pDVar2;
  char *pcVar3;
  QArrayData *data;
  parameter_type pQVar4;
  parameter_type pQVar5;
  QBindableInterface *pQVar6;
  long lVar7;
  
  if (_c == BindableProperty) {
    if (_id == 0) {
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>,_void>
                ::iface;
      lVar7 = 0x170;
    }
    else {
      if (_id != 1) {
        return;
      }
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>,_void>
                ::iface;
      lVar7 = 0x160;
    }
    plVar1 = (long *)*_a;
    *plVar1 = (long)&((_o->d_ptr).d)->_vptr_QObjectData + lVar7;
    plVar1[1] = (long)pQVar6;
  }
  else if (_c == WriteProperty) {
    if (_id == 1) {
      setTargetObject((QPropertyAnimation *)_o,(QObject *)(((QByteArray *)*_a)->d).d);
    }
    else if (_id == 0) {
      setPropertyName((QPropertyAnimation *)_o,(QByteArray *)*_a);
    }
  }
  else if (_c == ReadProperty) {
    plVar1 = (long *)*_a;
    if (_id == 1) {
      pQVar5 = QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
               ::value((QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
                        *)&(_o->d_ptr).d[4].children.d.ptr);
      *plVar1 = (long)pQVar5;
    }
    else if (_id == 0) {
      pQVar4 = QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
               ::value((QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
                        *)&(_o->d_ptr).d[4].field_0x30);
      pDVar2 = (pQVar4->d).d;
      pcVar3 = (pQVar4->d).ptr;
      lVar7 = (pQVar4->d).size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      data = (QArrayData *)*plVar1;
      *plVar1 = (long)pDVar2;
      plVar1[1] = (long)pcVar3;
      plVar1[2] = lVar7;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,1,0x10);
        }
      }
    }
  }
  return;
}

Assistant:

void QPropertyAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPropertyAnimation *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QByteArray*>(_v) = _t->propertyName(); break;
        case 1: *reinterpret_cast<QObject**>(_v) = _t->targetObject(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setPropertyName(*reinterpret_cast<QByteArray*>(_v)); break;
        case 1: _t->setTargetObject(*reinterpret_cast<QObject**>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindablePropertyName(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableTargetObject(); break;
        default: break;
        }
    }
}